

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

ostream * __thiscall cppcms::http::response::out(response *this)

{
  io_mode_type iVar1;
  _data *p_Var2;
  bool bVar3;
  service *psVar4;
  cached_settings *pcVar5;
  long lVar6;
  session_interface *this_00;
  cppcms_error *this_01;
  int iVar7;
  allocator local_71;
  undefined1 local_70 [40];
  __weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_48;
  __weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((*(uint *)&this->field_0x1c & 2) != 0) goto LAB_00203801;
  if ((*(uint *)&this->field_0x1c & 8) != 0) {
    this_01 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_70,"Request for output stream for finalized request is illegal",
               &local_71);
    cppcms_error::cppcms_error(this_01,(string *)local_70);
    __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  iVar1 = this->io_mode_;
  psVar4 = http::context::service(this->context_);
  pcVar5 = service::cached_settings(psVar4);
  p_Var2 = (this->d).ptr_;
  iVar7 = p_Var2->required_buffer_size;
  if (iVar1 - asynchronous < 2) {
    if (iVar7 == -1) {
      iVar7 = (pcVar5->service).async_output_buffer_size;
    }
    std::__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_38,
               &(p_Var2->conn).
                super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
    details::basic_device::open(&(p_Var2->buffered).super_basic_device,(char *)&local_38,iVar7);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38._M_refcount);
    p_Var2 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var2->output + *(long *)(*(long *)&p_Var2->output + -0x18)));
    p_Var2 = (this->d).ptr_;
    local_70._0_8_ = &p_Var2->buffered;
    std::__cxx11::
    list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
    ::push_front(&p_Var2->buffers,(value_type *)local_70);
    lVar6 = 0x160;
    if (this->io_mode_ == asynchronous_raw) {
LAB_00203675:
      (&(((this->d).ptr_)->headers).headers_._M_t._M_impl.field_0x0)[lVar6] = 1;
    }
  }
  else {
    if (iVar7 == -1) {
      iVar7 = (pcVar5->service).output_buffer_size;
    }
    std::__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_48,
               &(p_Var2->conn).
                super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
    details::basic_device::open(&(p_Var2->output_buf).super_basic_device,(char *)&local_48,iVar7);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_48._M_refcount);
    p_Var2 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var2->output + *(long *)(*(long *)&p_Var2->output + -0x18)));
    p_Var2 = (this->d).ptr_;
    local_70._0_8_ = &p_Var2->output_buf;
    std::__cxx11::
    list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
    ::push_front(&p_Var2->buffers,(value_type *)local_70);
    lVar6 = 0x3e0;
    if (this->io_mode_ == raw) goto LAB_00203675;
  }
  this->field_0x1c = this->field_0x1c | 2;
  bVar3 = need_gzip(this);
  if (bVar3) {
    std::__cxx11::string::string((string *)local_70,"gzip",&local_71);
    content_encoding(this,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  if ((this->io_mode_ != raw) && (this->io_mode_ != asynchronous_raw)) {
    this_00 = http::context::session(this->context_);
    session_interface::save(this_00);
    write_http_headers(this);
  }
  if ((this->field_0x1c & 4) != 0) {
    p_Var2 = (this->d).ptr_;
    lVar6 = *(long *)&p_Var2->output;
    (p_Var2->cached).out_ = *(streambuf **)(&p_Var2->field_0x4f0 + *(long *)(lVar6 + -0x18));
    std::ios::rdbuf((streambuf *)(&p_Var2->output + *(long *)(lVar6 + -0x18)));
    p_Var2 = (this->d).ptr_;
    local_70._0_8_ = &p_Var2->cached;
    std::__cxx11::
    list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
    ::push_front(&p_Var2->buffers,(value_type *)local_70);
  }
  if (bVar3) {
    psVar4 = http::context::service(this->context_);
    pcVar5 = service::cached_settings(psVar4);
    iVar7 = (pcVar5->gzip).level;
    psVar4 = http::context::service(this->context_);
    pcVar5 = service::cached_settings(psVar4);
    p_Var2 = (this->d).ptr_;
    details::gzip_buf::open
              (&p_Var2->zbuf,
               (char *)(p_Var2->buffers).
                       super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next,iVar7,
               (ulong)(uint)(pcVar5->gzip).buffer);
    p_Var2 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var2->output + *(long *)(*(long *)&p_Var2->output + -0x18)));
    p_Var2 = (this->d).ptr_;
    local_70._0_8_ = &p_Var2->zbuf;
    std::__cxx11::
    list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
    ::push_front(&p_Var2->buffers,(value_type *)local_70);
  }
  http::context::locale((context *)local_70);
  std::ios::imbue((locale *)(local_70 + 0x20));
  std::locale::~locale((locale *)(local_70 + 0x20));
  std::locale::~locale((locale *)local_70);
LAB_00203801:
  return &((this->d).ptr_)->output;
}

Assistant:

std::ostream &response::out()
{
	if(ostream_requested_)
		return d->output;

	if(finalized_)
		throw cppcms_error("Request for output stream for finalized request is illegal");
	
	if(io_mode_ == asynchronous || io_mode_ == asynchronous_raw)  {
		size_t bsize = context_.service().cached_settings().service.async_output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->buffered.open(d->conn,bsize);
		d->output.rdbuf(&d->buffered);
		d->buffers.push_front(&d->buffered);
		if(io_mode_ == asynchronous_raw)
			d->buffered.raw_mode(true);
	}
	else { 
		size_t bsize = context_.service().cached_settings().service.output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->output_buf.open(d->conn,bsize);
		d->output.rdbuf(&d->output_buf);
		d->buffers.push_front(&d->output_buf);
		if(io_mode_ == raw)
			d->output_buf.raw_mode(true);
	}
	
	ostream_requested_=1;
	
	#ifndef CPPCMS_NO_GZIP
	bool gzip = need_gzip();
	
	if(gzip) {
		content_encoding("gzip");
	}
	#endif

	// Now we shoulde write headers -- before comrpession
	if(io_mode_ != raw && io_mode_ != asynchronous_raw) {
		context_.session().save();
		write_http_headers();
	}
	
	if(copy_to_cache_) {
		d->cached.open(d->output.rdbuf());
		d->output.rdbuf(&d->cached);
		d->buffers.push_front(&d->cached);
	}
	
	#ifndef CPPCMS_NO_GZIP
	if(gzip) {
		int level=context_.service().cached_settings().gzip.level;
		int buffer=context_.service().cached_settings().gzip.buffer;
		d->zbuf.open(d->buffers.front(),level,buffer);
		d->output.rdbuf(&d->zbuf);
		d->buffers.push_front(&d->zbuf);
	}
	#endif
	
	d->output.imbue(context_.locale());
	return d->output;
}